

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

int __thiscall CImage::Load(CImage *this,char *szFilename)

{
  int iVar1;
  char *__s1;
  
  if (szFilename == (char *)0x0) {
    return 0x3c;
  }
  __s1 = strrchr(szFilename,0x2e);
  if (__s1 != (char *)0x0) {
    iVar1 = strcasecmp(__s1,".tga");
    if (iVar1 == 0) {
      iVar1 = LoadTga(this,szFilename);
      return iVar1;
    }
  }
  iVar1 = LoadBmp(this,szFilename);
  return iVar1;
}

Assistant:

int DLL CImage::Load(char *szFilename)
{
  int nRes = 0;

  if ( szFilename != NULL ) 
  {
    char * szExt = strrchr( szFilename, '.' );
    int nNotTGA = 1;

    if ( szExt != NULL ) 
      nNotTGA = _stricmp( szExt, ".tga" );

    if ( nNotTGA != 0 )
      nRes = LoadBmp( szFilename );
    else
      nRes = LoadTga( szFilename );
  }
  else
    nRes = eLoadFilename;

  return nRes;
}